

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConnectionAddressFilter.cpp
# Opt level: O2

KBOOL __thiscall
KDIS::NETWORK::ConnectionAddressFilter::OnDataReceived
          (ConnectionAddressFilter *this,KOCTET *Data,KUINT32 DataLength,KString *SenderIp)

{
  KBOOL KVar1;
  
  KVar1 = TestAddress(this,SenderIp);
  return KVar1;
}

Assistant:

KBOOL ConnectionAddressFilter::OnDataReceived( const KOCTET * Data, KUINT32 DataLength, const KString & SenderIp )
{
	return TestAddress( SenderIp );
}